

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.hpp
# Opt level: O3

void __thiscall randomx::JitCompilerX86::genAddressRegDst(JitCompilerX86 *this,Instruction *instr)

{
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  puVar1 = this->code;
  iVar2 = this->codePos;
  (puVar1 + iVar2)[0] = 'A';
  (puVar1 + iVar2)[1] = 0x8d;
  iVar2 = this->codePos + 2;
  this->codePos = iVar2;
  this->code[iVar2] = instr->dst + 0x80;
  uVar4 = (long)this->codePos + 1;
  this->codePos = (int32_t)uVar4;
  if (instr->dst == '\x04') {
    this->code[uVar4] = '$';
    uVar3 = this->codePos + 1;
    uVar4 = (ulong)uVar3;
    this->codePos = uVar3;
  }
  *(uint32_t *)(this->code + (int)uVar4) = instr->imm32;
  iVar2 = this->codePos + 4;
  this->codePos = iVar2;
  this->code[iVar2] = '%';
  iVar2 = this->codePos;
  this->codePos = iVar2 + 1;
  uVar6 = 0x3ff8;
  if ((instr->mod & 3) == 0) {
    uVar6 = 0x3fff8;
  }
  uVar5 = 0x1ffff8;
  if (instr->mod < 0xe0) {
    uVar5 = uVar6;
  }
  *(undefined4 *)(this->code + (long)iVar2 + 1) = uVar5;
  this->codePos = this->codePos + 4;
  return;
}

Assistant:

void emit(const uint8_t* src, size_t count) {
			memcpy(code + codePos, src, count);
			codePos += count;
		}